

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O1

void __thiscall ResolverImp::~ResolverImp(ResolverImp *this)

{
  ResolverThread::stop(this->rt_);
  if ((this->t_)._M_id._M_thread != 0) {
    std::thread::join();
  }
  if ((this->t_)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

~ResolverImp() {
        rt_.stop();
        if (t_.joinable())
            t_.join();
    }